

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O1

CK_OBJECT_HANDLE __thiscall
HandleManager::addTokenObject
          (HandleManager *this,CK_SLOT_ID slotID,bool isPrivate,CK_VOID_PTR object)

{
  _Base_ptr p_Var1;
  mapped_type mVar2;
  _Base_ptr p_Var3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  CK_ULONG *__k;
  iterator __position;
  bool bVar9;
  MutexLocker lock;
  Handle h;
  CK_VOID_PTR local_60;
  MutexLocker local_58;
  Handle local_48;
  
  local_60 = object;
  MutexLocker::MutexLocker(&local_58,this->handlesMutex);
  p_Var8 = &(this->objects)._M_t._M_impl.super__Rb_tree_header;
  p_Var1 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var8->_M_header;
  for (; p_Var1 != (_Base_ptr)0x0;
      p_Var1 = (&p_Var1->_M_left)[*(CK_VOID_PTR *)(p_Var1 + 1) < local_60]) {
    if (*(CK_VOID_PTR *)(p_Var1 + 1) >= local_60) {
      p_Var6 = p_Var1;
    }
  }
  __position._M_node = &p_Var8->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var8) &&
     (__position._M_node = p_Var6, local_60 < *(CK_VOID_PTR *)(p_Var6 + 1))) {
    __position._M_node = &p_Var8->_M_header;
  }
  if ((_Rb_tree_header *)__position._M_node == p_Var8) {
    Handle::Handle(&local_48,2,slotID);
    local_48.object = local_60;
    this->handleCounter = this->handleCounter + 1;
    __k = &this->handleCounter;
    local_48.isPrivate = isPrivate;
    pmVar4 = std::
             map<unsigned_long,_Handle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
             ::operator[](&this->handles,__k);
    pmVar4->isPrivate = local_48.isPrivate;
    pmVar4->hSession = local_48.hSession;
    pmVar4->object = local_48.object;
    pmVar4->kind = local_48.kind;
    pmVar4->slotID = local_48.slotID;
    mVar2 = *__k;
    pmVar5 = std::
             map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
             ::operator[](&this->objects,&local_60);
    *pmVar5 = mVar2;
    p_Var7 = (_Base_ptr)*__k;
  }
  else {
    p_Var7 = (this->handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var8 = &(this->handles)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var8->_M_header;
    if (p_Var7 != (_Base_ptr)0x0) {
      do {
        bVar9 = *(_Base_ptr *)(p_Var7 + 1) < __position._M_node[1]._M_parent;
        if (!bVar9) {
          p_Var3 = p_Var7;
        }
        p_Var7 = (&p_Var7->_M_left)[bVar9];
      } while (p_Var7 != (_Base_ptr)0x0);
    }
    p_Var7 = &p_Var8->_M_header;
    if (((_Rb_tree_header *)p_Var3 != p_Var8) &&
       (p_Var7 = p_Var3, __position._M_node[1]._M_parent < *(_Base_ptr *)(p_Var3 + 1))) {
      p_Var7 = &p_Var8->_M_header;
    }
    if ((((_Rb_tree_header *)p_Var7 == p_Var8) || (p_Var7[1]._M_parent != (_Base_ptr)0x2)) ||
       (p_Var7[1]._M_left != (_Base_ptr)slotID)) {
      std::
      _Rb_tree<void*,std::pair<void*const,unsigned_long>,std::_Select1st<std::pair<void*const,unsigned_long>>,std::less<void*>,std::allocator<std::pair<void*const,unsigned_long>>>
      ::erase_abi_cxx11_((_Rb_tree<void*,std::pair<void*const,unsigned_long>,std::_Select1st<std::pair<void*const,unsigned_long>>,std::less<void*>,std::allocator<std::pair<void*const,unsigned_long>>>
                          *)&this->objects,__position);
      p_Var7 = (_Base_ptr)0x0;
    }
    else {
      p_Var7 = __position._M_node[1]._M_parent;
    }
  }
  MutexLocker::~MutexLocker(&local_58);
  return (CK_OBJECT_HANDLE)p_Var7;
}

Assistant:

CK_OBJECT_HANDLE HandleManager::addTokenObject(CK_SLOT_ID slotID, bool isPrivate, CK_VOID_PTR object)
{
	MutexLocker lock(handlesMutex);

	// Return existing handle when the object has already been registered.
	std::map< CK_VOID_PTR, CK_ULONG>::iterator oit = objects.find(object);
	if (oit != objects.end()) {
		std::map< CK_ULONG, Handle>::iterator hit = handles.find(oit->second);
		if (hit == handles.end() || CKH_OBJECT != hit->second.kind || slotID != hit->second.slotID) {
			objects.erase(oit);
			return CK_INVALID_HANDLE;
		} else
			return oit->second;
	}

	// Token objects are not associated with a specific session.
	Handle h( CKH_OBJECT, slotID );
	h.isPrivate = isPrivate;
	h.object = object;
	handles[++handleCounter] = h;
	objects[object] = handleCounter;
	return (CK_OBJECT_HANDLE)handleCounter;
}